

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

int __thiscall QAccessibleAbstractScrollArea::childCount(QAccessibleAbstractScrollArea *this)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QAccessibleAbstractScrollArea *in_stack_00000018;
  QList<QWidget_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  accessibleChildren(in_stack_00000018);
  qVar1 = QList<QWidget_*>::size(&local_20);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7d5aa4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)qVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleAbstractScrollArea::childCount() const
{
    return accessibleChildren().size();
}